

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

void mi_segment_span_free
               (mi_segment_t *segment,size_t slice_index,size_t slice_count,_Bool allow_purge,
               mi_segments_tld_t *tld)

{
  mi_slice_t *pmVar1;
  mi_option_t option;
  _Bool _Var2;
  mi_span_queue_t *pmVar3;
  ulong uVar4;
  long lVar5;
  mi_msecs_t mVar6;
  long lVar7;
  mi_page_s **ppmVar8;
  mi_page_s *pmVar9;
  ulong uVar10;
  uint8_t *p;
  mi_page_s *pmVar11;
  size_t sVar12;
  size_t full_size;
  uint8_t *local_b8;
  mi_commit_mask_t mask;
  mi_commit_mask_t local_70;
  
  if ((segment->kind == MI_SEGMENT_HUGE) || (segment->thread_id == 0)) {
    pmVar3 = (mi_span_queue_t *)0x0;
  }
  else {
    pmVar3 = mi_span_queue_for(slice_count,tld);
  }
  pmVar11 = segment->slices + slice_index;
  segment->slices[slice_index].slice_offset = 0;
  sVar12 = 1;
  if (1 < slice_count) {
    sVar12 = slice_count;
  }
  pmVar11->slice_count = (uint32_t)sVar12;
  if (1 < slice_count) {
    pmVar9 = segment->slices + segment->slice_entries;
    if (pmVar11 + (sVar12 - 1) <= segment->slices + segment->slice_entries) {
      pmVar9 = pmVar11 + (sVar12 - 1);
    }
    pmVar9->slice_count = 0;
    pmVar9->slice_offset = (uint32_t)sVar12 * 0x60 - 0x60;
    pmVar9->block_size = 0;
  }
  if (allow_purge) {
    uVar4 = (ulong)((long)segment->slices[slice_index - 1].padding + 7U) & 0xfffffffffe000000;
    uVar10 = 0;
    if (0 < (long)uVar4) {
      uVar10 = uVar4;
    }
    if (segment->allow_purge == true) {
      p = (uint8_t *)(uVar10 + ((long)((long)pmVar11 + (-0x120 - uVar10)) / 0x60) * 0x10000);
      lVar5 = mi_option_get(mi_option_purge_delay);
      if (lVar5 == 0) {
        mi_segment_purge(segment,p,sVar12 << 0x10);
      }
      else {
        full_size = 0;
        mi_segment_commit_mask(segment,true,p,sVar12 << 0x10,&local_b8,&full_size,&mask);
        _Var2 = mi_commit_mask_is_empty(&mask);
        if ((!_Var2) && (full_size != 0)) {
          mi_commit_mask_create_intersect(&segment->commit_mask,&mask,&local_70);
          mi_commit_mask_set(&segment->purge_mask,&local_70);
          mVar6 = _mi_clock_now();
          lVar5 = segment->purge_expire;
          if (lVar5 == 0) {
            option = mi_option_purge_delay;
          }
          else {
            lVar7 = mi_option_get(mi_option_purge_extend_delay);
            if (mVar6 < lVar5) {
              segment->purge_expire = segment->purge_expire + lVar7;
              goto LAB_007cd6df;
            }
            if (lVar7 + lVar5 <= mVar6) {
              mi_segment_try_purge(segment,true);
              goto LAB_007cd6df;
            }
            option = mi_option_purge_extend_delay;
          }
          lVar5 = mi_option_get(option);
          segment->purge_expire = lVar5 + mVar6;
        }
      }
    }
  }
LAB_007cd6df:
  if (pmVar3 != (mi_span_queue_t *)0x0) {
    segment->slices[slice_index].prev = (mi_page_s *)0x0;
    pmVar1 = pmVar3->first;
    segment->slices[slice_index].next = pmVar1;
    pmVar3->first = pmVar11;
    ppmVar8 = &pmVar1->prev;
    if (pmVar1 == (mi_slice_t *)0x0) {
      ppmVar8 = &pmVar3->last;
    }
    *ppmVar8 = pmVar11;
  }
  segment->slices[slice_index].block_size = 0;
  return;
}

Assistant:

static void mi_segment_span_free(mi_segment_t* segment, size_t slice_index, size_t slice_count, bool allow_purge, mi_segments_tld_t* tld) {
  mi_assert_internal(slice_index < segment->slice_entries);
  mi_span_queue_t* sq = (segment->kind == MI_SEGMENT_HUGE || mi_segment_is_abandoned(segment)
                          ? NULL : mi_span_queue_for(slice_count,tld));
  if (slice_count==0) slice_count = 1;
  mi_assert_internal(slice_index + slice_count - 1 < segment->slice_entries);

  // set first and last slice (the intermediates can be undetermined)
  mi_slice_t* slice = &segment->slices[slice_index];
  slice->slice_count = (uint32_t)slice_count;
  mi_assert_internal(slice->slice_count == slice_count); // no overflow?
  slice->slice_offset = 0;
  if (slice_count > 1) {
    mi_slice_t* last = slice + slice_count - 1;
    mi_slice_t* end  = (mi_slice_t*)mi_segment_slices_end(segment);
    if (last > end) { last = end; }
    last->slice_count = 0;
    last->slice_offset = (uint32_t)(sizeof(mi_page_t)*(slice_count - 1));
    last->block_size = 0;
  }

  // perhaps decommit
  if (allow_purge) {
    mi_segment_schedule_purge(segment, mi_slice_start(slice), slice_count * MI_SEGMENT_SLICE_SIZE);
  }

  // and push it on the free page queue (if it was not a huge page)
  if (sq != NULL) mi_span_queue_push( sq, slice );
             else slice->block_size = 0; // mark huge page as free anyways
}